

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

bool __thiscall
sentencepiece::SentencePieceProcessor::IsControl(SentencePieceProcessor *this,int id)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer pMVar5;
  Status local_40;
  byte local_36;
  Die local_35 [13];
  Status local_28;
  uint local_1c;
  SentencePieceProcessor *pSStack_18;
  int id_local;
  SentencePieceProcessor *this_local;
  
  local_1c = id;
  pSStack_18 = this;
  (*this->_vptr_SentencePieceProcessor[7])();
  bVar1 = util::Status::ok(&local_28);
  util::Status::~Status(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pMVar5 = std::
             unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
             ::operator->(&this->model_);
    iVar2 = (*pMVar5->_vptr_ModelInterface[0x13])(pMVar5,(ulong)local_1c);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  else {
    iVar2 = logging::GetMinLogLevel();
    local_36 = 0;
    if (iVar2 < 3) {
      error::Die::Die(local_35,false);
      local_36 = 1;
      pcVar3 = logging::BaseName("src/sentencepiece_processor.cc");
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3cf);
      poVar4 = std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(poVar4,"LOG(");
      poVar4 = std::operator<<(poVar4,"ERROR");
      poVar4 = std::operator<<(poVar4,") ");
      (*this->_vptr_SentencePieceProcessor[7])(&local_40);
      pcVar3 = util::Status::message(&local_40);
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"\nReturns default value ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
      error::Die::operator&(local_35,poVar4);
      util::Status::~Status(&local_40);
    }
    if ((local_36 & 1) != 0) {
      error::Die::~Die(local_35);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SentencePieceProcessor::IsControl(int id) const {
  CHECK_STATUS_OR_RETURN_DEFAULT(0);
  return model_->IsControl(id);
}